

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

cmListFileBacktrace __thiscall
cmListFileBacktrace::Push(cmListFileBacktrace *this,cmListFileContext *lfc)

{
  cmStateSnapshot *this_00;
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  cmListFileBacktrace cVar2;
  
  this_00 = (cmStateSnapshot *)(lfc->Name)._M_dataplus._M_p;
  if (this_00 == (cmStateSnapshot *)0x0) {
    __assert_fail("this->TopEntry",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListFileCache.cxx"
                  ,0x170,
                  "cmListFileBacktrace cmListFileBacktrace::Push(const cmListFileContext &) const");
  }
  if (this_00[3].State == (cmState *)0x0) {
    bVar1 = cmStateSnapshot::IsValid(this_00);
    if (!bVar1) {
      __assert_fail("!this->TopEntry->IsBottom() || this->TopEntry->Bottom.IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmListFileCache.cxx"
                    ,0x171,
                    "cmListFileBacktrace cmListFileBacktrace::Push(const cmListFileContext &) const"
                   );
    }
  }
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &stack0xffffffffffffffd0,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)lfc);
  std::
  make_shared<cmListFileBacktrace::Entry_const,std::shared_ptr<cmListFileBacktrace::Entry_const>,cmListFileContext_const&>
            (&this->TopEntry,(cmListFileContext *)&stack0xffffffffffffffd0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  cVar2.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  cVar2.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar2.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmListFileBacktrace::Push(
  cmListFileContext const& lfc) const
{
  assert(this->TopEntry);
  assert(!this->TopEntry->IsBottom() || this->TopEntry->Bottom.IsValid());
  return cmListFileBacktrace(this->TopEntry, lfc);
}